

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse2::BVHNIntersector1<4,_257,_false,_embree::sse2::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  char cVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  vfloat4 a0;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar57 [12];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  vfloat4 a;
  undefined1 auVar63 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar72;
  undefined1 auVar70 [16];
  float fVar73;
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar65 = ray->tfar, 0.0 <= fVar65)) {
    fVar13 = (ray->dir).field_0.m128[0];
    fVar14 = (ray->dir).field_0.m128[1];
    fVar15 = (ray->dir).field_0.m128[2];
    fVar49 = (ray->dir).field_0.m128[3];
    fVar32 = fVar14 * fVar14;
    fVar33 = fVar15 * fVar15;
    fVar34 = fVar49 * fVar49;
    fVar44 = fVar32 + fVar13 * fVar13 + fVar33;
    auVar50._0_8_ = CONCAT44(fVar32 + fVar32 + fVar34,fVar44);
    auVar50._8_4_ = fVar32 + fVar33 + fVar33;
    auVar50._12_4_ = fVar32 + fVar34 + fVar34;
    auVar37._8_4_ = auVar50._8_4_;
    auVar37._0_8_ = auVar50._0_8_;
    auVar37._12_4_ = auVar50._12_4_;
    auVar50 = rsqrtss(auVar37,auVar50);
    fVar32 = auVar50._0_4_;
    local_818[0] = fVar32 * 1.5 - fVar32 * fVar32 * fVar44 * 0.5 * fVar32;
    fVar32 = fVar13 * local_818[0];
    fVar33 = fVar14 * local_818[0];
    fVar34 = fVar15 * local_818[0];
    fVar60 = -fVar33;
    fVar44 = -fVar34;
    auVar57._8_4_ = 0xffffffff;
    auVar57._0_8_ = 0xffffffffffffffff;
    if (fVar60 * fVar60 + fVar34 * fVar34 + 0.0 <= fVar32 * fVar32 + fVar44 * fVar44 + 0.0) {
      auVar57 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar54 = (float)((uint)fVar34 & auVar57._4_4_);
    fVar44 = (float)(~auVar57._0_4_ & (uint)fVar44);
    fVar56 = (float)(~auVar57._8_4_ & (uint)fVar32 | (uint)fVar60 & auVar57._8_4_);
    fVar60 = fVar54 * fVar54;
    fVar55 = fVar56 * fVar56;
    fVar61 = fVar60 + fVar44 * fVar44 + fVar55;
    fVar62 = fVar60 + fVar60 + 0.0;
    fVar55 = fVar60 + fVar55 + fVar55;
    fVar60 = fVar60 + 0.0 + 0.0;
    auVar63._4_4_ = fVar62;
    auVar63._0_4_ = fVar61;
    auVar63._8_4_ = fVar55;
    auVar63._12_4_ = fVar60;
    auVar41._4_4_ = fVar62;
    auVar41._0_4_ = fVar61;
    auVar41._8_4_ = fVar55;
    auVar41._12_4_ = fVar60;
    auVar50 = rsqrtss(auVar63,auVar41);
    fVar60 = auVar50._0_4_;
    fVar60 = fVar60 * 1.5 - fVar60 * fVar60 * fVar61 * 0.5 * fVar60;
    fVar44 = fVar60 * fVar44;
    fVar54 = fVar60 * fVar54;
    fVar56 = fVar60 * fVar56;
    fVar55 = fVar54 * fVar32 - fVar33 * fVar44;
    fVar61 = fVar56 * fVar33 - fVar34 * fVar54;
    fVar62 = fVar44 * fVar34 - fVar32 * fVar56;
    fVar59 = fVar60 * 0.0 * fVar49 * local_818[0] - fVar49 * local_818[0] * fVar60 * 0.0;
    fVar60 = fVar61 * fVar61;
    fVar58 = fVar62 * fVar62;
    fVar59 = fVar59 * fVar59;
    fVar64 = fVar58 + fVar60 + fVar55 * fVar55;
    fVar66 = fVar59 + fVar60 + fVar60;
    fVar58 = fVar58 + fVar60 + fVar58;
    fVar59 = fVar59 + fVar60 + fVar59;
    auVar53._4_4_ = fVar66;
    auVar53._0_4_ = fVar64;
    auVar53._8_4_ = fVar58;
    auVar53._12_4_ = fVar59;
    auVar48._4_4_ = fVar66;
    auVar48._0_4_ = fVar64;
    auVar48._8_4_ = fVar58;
    auVar48._12_4_ = fVar59;
    auVar50 = rsqrtss(auVar53,auVar48);
    fVar60 = auVar50._0_4_;
    fVar60 = fVar60 * 1.5 - fVar60 * fVar60 * fVar64 * 0.5 * fVar60;
    local_808._4_4_ = fVar60 * fVar61;
    local_808._0_4_ = fVar44;
    local_808._8_4_ = local_818[0] * fVar32;
    local_808._12_4_ = 0;
    local_7f8._4_4_ = fVar60 * fVar62;
    local_7f8._0_4_ = fVar54;
    local_7f8._8_4_ = local_818[0] * fVar33;
    local_7f8._12_4_ = 0;
    local_7e8._4_4_ = fVar60 * fVar55;
    local_7e8._0_4_ = fVar56;
    local_7e8._8_4_ = local_818[0] * fVar34;
    local_7e8._12_4_ = 0;
    puVar22 = local_7d0;
    local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar32 = (ray->org).field_0.m128[0];
    fVar33 = (ray->org).field_0.m128[1];
    fVar34 = (ray->org).field_0.m128[2];
    fVar44 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar60 = 0.0;
    if (0.0 <= fVar44) {
      fVar60 = fVar44;
    }
    uVar25 = -(uint)((float)DAT_01f4bd50 <= ABS(fVar13));
    uVar26 = -(uint)(DAT_01f4bd50._4_4_ <= ABS(fVar14));
    uVar27 = -(uint)(DAT_01f4bd50._8_4_ <= ABS(fVar15));
    uVar28 = -(uint)(DAT_01f4bd50._12_4_ <= ABS(fVar49));
    auVar39._0_4_ = (uint)fVar13 & uVar25;
    auVar39._4_4_ = (uint)fVar14 & uVar26;
    auVar39._8_4_ = (uint)fVar15 & uVar27;
    auVar39._12_4_ = (uint)fVar49 & uVar28;
    auVar35._0_4_ = ~uVar25 & (uint)(float)DAT_01f4bd50;
    auVar35._4_4_ = ~uVar26 & (uint)DAT_01f4bd50._4_4_;
    auVar35._8_4_ = ~uVar27 & (uint)DAT_01f4bd50._8_4_;
    auVar35._12_4_ = ~uVar28 & (uint)DAT_01f4bd50._12_4_;
    auVar35 = auVar35 | auVar39;
    auVar50 = rcpps(auVar39,auVar35);
    fVar49 = auVar50._0_4_;
    fVar44 = auVar50._4_4_;
    fVar54 = auVar50._8_4_;
    fVar49 = (1.0 - auVar35._0_4_ * fVar49) * fVar49 + fVar49;
    fVar44 = (1.0 - auVar35._4_4_ * fVar44) * fVar44 + fVar44;
    fVar54 = (1.0 - auVar35._8_4_ * fVar54) * fVar54 + fVar54;
    uVar24 = (ulong)(fVar49 < 0.0) * 0x10;
    uVar21 = (ulong)(fVar44 < 0.0) << 4 | 0x20;
    uVar23 = (ulong)(fVar54 < 0.0) << 4 | 0x40;
    auVar67._4_4_ = fVar65;
    auVar67._0_4_ = fVar65;
    auVar67._8_4_ = fVar65;
    auVar67._12_4_ = fVar65;
LAB_00566db0:
    if (puVar22 != &local_7d8) {
      uVar19 = puVar22[-1];
      puVar22 = puVar22 + -1;
LAB_00566dc1:
      if ((uVar19 & 0xf) == 0) {
        pfVar1 = (float *)(uVar19 + 0x20 + uVar24);
        auVar40._0_4_ = (*pfVar1 - fVar32) * fVar49;
        auVar40._4_4_ = (pfVar1[1] - fVar32) * fVar49;
        auVar40._8_4_ = (pfVar1[2] - fVar32) * fVar49;
        auVar40._12_4_ = (pfVar1[3] - fVar32) * fVar49;
        pfVar1 = (float *)(uVar19 + 0x20 + uVar21);
        auVar29._0_4_ = (*pfVar1 - fVar33) * fVar44;
        auVar29._4_4_ = (pfVar1[1] - fVar33) * fVar44;
        auVar29._8_4_ = (pfVar1[2] - fVar33) * fVar44;
        auVar29._12_4_ = (pfVar1[3] - fVar33) * fVar44;
        auVar41 = maxps(auVar40,auVar29);
        pfVar1 = (float *)(uVar19 + 0x20 + uVar23);
        auVar30._0_4_ = (*pfVar1 - fVar34) * fVar54;
        auVar30._4_4_ = (pfVar1[1] - fVar34) * fVar54;
        auVar30._8_4_ = (pfVar1[2] - fVar34) * fVar54;
        auVar30._12_4_ = (pfVar1[3] - fVar34) * fVar54;
        pfVar1 = (float *)(uVar19 + 0x20 + (uVar24 ^ 0x10));
        auVar36._0_4_ = (*pfVar1 - fVar32) * fVar49;
        auVar36._4_4_ = (pfVar1[1] - fVar32) * fVar49;
        auVar36._8_4_ = (pfVar1[2] - fVar32) * fVar49;
        auVar36._12_4_ = (pfVar1[3] - fVar32) * fVar49;
        pfVar1 = (float *)(uVar19 + 0x20 + (uVar21 ^ 0x10));
        auVar45._0_4_ = (*pfVar1 - fVar33) * fVar44;
        auVar45._4_4_ = (pfVar1[1] - fVar33) * fVar44;
        auVar45._8_4_ = (pfVar1[2] - fVar33) * fVar44;
        auVar45._12_4_ = (pfVar1[3] - fVar33) * fVar44;
        auVar37 = minps(auVar36,auVar45);
        pfVar1 = (float *)(uVar19 + 0x20 + (uVar23 ^ 0x10));
        auVar46._0_4_ = (*pfVar1 - fVar34) * fVar54;
        auVar46._4_4_ = (pfVar1[1] - fVar34) * fVar54;
        auVar46._8_4_ = (pfVar1[2] - fVar34) * fVar54;
        auVar46._12_4_ = (pfVar1[3] - fVar34) * fVar54;
        auVar7._4_4_ = fVar60;
        auVar7._0_4_ = fVar60;
        auVar7._8_4_ = fVar60;
        auVar7._12_4_ = fVar60;
        auVar50 = maxps(auVar30,auVar7);
        auVar41 = maxps(auVar41,auVar50);
        auVar50 = minps(auVar46,auVar67);
        auVar50 = minps(auVar37,auVar50);
        bVar3 = auVar41._0_4_ <= auVar50._0_4_;
        bVar4 = auVar41._4_4_ <= auVar50._4_4_;
        bVar5 = auVar41._8_4_ <= auVar50._8_4_;
        bVar6 = auVar41._12_4_ <= auVar50._12_4_;
        uVar18 = 0;
      }
      else {
        if ((int)(uVar19 & 0xf) != 2) {
          cVar17 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar19 & 0xfffffffffffffff0) * 0x40 + 8))
                             (local_818,ray,context);
          if (cVar17 != '\0') {
            ray->tfar = -INFINITY;
            return;
          }
          goto LAB_00566db0;
        }
        uVar18 = uVar19 & 0xfffffffffffffff0;
        fVar66 = fVar13 * *(float *)(uVar18 + 0x20) +
                 fVar14 * *(float *)(uVar18 + 0x50) + fVar15 * *(float *)(uVar18 + 0x80);
        fVar75 = fVar13 * *(float *)(uVar18 + 0x24) +
                 fVar14 * *(float *)(uVar18 + 0x54) + fVar15 * *(float *)(uVar18 + 0x84);
        fVar76 = fVar13 * *(float *)(uVar18 + 0x28) +
                 fVar14 * *(float *)(uVar18 + 0x58) + fVar15 * *(float *)(uVar18 + 0x88);
        fVar77 = fVar13 * *(float *)(uVar18 + 0x2c) +
                 fVar14 * *(float *)(uVar18 + 0x5c) + fVar15 * *(float *)(uVar18 + 0x8c);
        fVar78 = fVar13 * *(float *)(uVar18 + 0x30) +
                 fVar14 * *(float *)(uVar18 + 0x60) + fVar15 * *(float *)(uVar18 + 0x90);
        fVar79 = fVar13 * *(float *)(uVar18 + 0x34) +
                 fVar14 * *(float *)(uVar18 + 100) + fVar15 * *(float *)(uVar18 + 0x94);
        fVar80 = fVar13 * *(float *)(uVar18 + 0x38) +
                 fVar14 * *(float *)(uVar18 + 0x68) + fVar15 * *(float *)(uVar18 + 0x98);
        fVar81 = fVar13 * *(float *)(uVar18 + 0x3c) +
                 fVar14 * *(float *)(uVar18 + 0x6c) + fVar15 * *(float *)(uVar18 + 0x9c);
        fVar65 = fVar13 * *(float *)(uVar18 + 0x40) +
                 fVar14 * *(float *)(uVar18 + 0x70) + fVar15 * *(float *)(uVar18 + 0xa0);
        fVar55 = fVar13 * *(float *)(uVar18 + 0x44) +
                 fVar14 * *(float *)(uVar18 + 0x74) + fVar15 * *(float *)(uVar18 + 0xa4);
        fVar56 = fVar13 * *(float *)(uVar18 + 0x48) +
                 fVar14 * *(float *)(uVar18 + 0x78) + fVar15 * *(float *)(uVar18 + 0xa8);
        fVar61 = fVar13 * *(float *)(uVar18 + 0x4c) +
                 fVar14 * *(float *)(uVar18 + 0x7c) + fVar15 * *(float *)(uVar18 + 0xac);
        fVar62 = (float)DAT_01f4bd50;
        fVar58 = DAT_01f4bd50._4_4_;
        fVar59 = DAT_01f4bd50._8_4_;
        fVar64 = DAT_01f4bd50._12_4_;
        uVar25 = -(uint)(fVar62 <= ABS(fVar66));
        uVar26 = -(uint)(fVar58 <= ABS(fVar75));
        uVar27 = -(uint)(fVar59 <= ABS(fVar76));
        uVar28 = -(uint)(fVar64 <= ABS(fVar77));
        auVar68._0_4_ = ~uVar25 & (uint)fVar62;
        auVar68._4_4_ = ~uVar26 & (uint)fVar58;
        auVar68._8_4_ = ~uVar27 & (uint)fVar59;
        auVar68._12_4_ = ~uVar28 & (uint)fVar64;
        auVar11._4_4_ = (uint)fVar75 & uVar26;
        auVar11._0_4_ = (uint)fVar66 & uVar25;
        auVar11._8_4_ = (uint)fVar76 & uVar27;
        auVar11._12_4_ = (uint)fVar77 & uVar28;
        auVar68 = auVar68 | auVar11;
        uVar25 = -(uint)(fVar62 <= ABS(fVar78));
        uVar26 = -(uint)(fVar58 <= ABS(fVar79));
        uVar27 = -(uint)(fVar59 <= ABS(fVar80));
        uVar28 = -(uint)(fVar64 <= ABS(fVar81));
        auVar70._0_4_ = ~uVar25 & (uint)fVar62;
        auVar70._4_4_ = ~uVar26 & (uint)fVar58;
        auVar70._8_4_ = ~uVar27 & (uint)fVar59;
        auVar70._12_4_ = ~uVar28 & (uint)fVar64;
        auVar12._4_4_ = (uint)fVar79 & uVar26;
        auVar12._0_4_ = (uint)fVar78 & uVar25;
        auVar12._8_4_ = (uint)fVar80 & uVar27;
        auVar12._12_4_ = (uint)fVar81 & uVar28;
        auVar70 = auVar70 | auVar12;
        uVar25 = -(uint)(fVar62 <= ABS(fVar65));
        uVar26 = -(uint)(fVar58 <= ABS(fVar55));
        uVar27 = -(uint)(fVar59 <= ABS(fVar56));
        uVar28 = -(uint)(fVar64 <= ABS(fVar61));
        auVar74._0_4_ = ~uVar25 & (uint)fVar62;
        auVar74._4_4_ = ~uVar26 & (uint)fVar58;
        auVar74._8_4_ = ~uVar27 & (uint)fVar59;
        auVar74._12_4_ = ~uVar28 & (uint)fVar64;
        auVar8._4_4_ = (uint)fVar55 & uVar26;
        auVar8._0_4_ = (uint)fVar65 & uVar25;
        auVar8._8_4_ = (uint)fVar56 & uVar27;
        auVar8._12_4_ = (uint)fVar61 & uVar28;
        auVar74 = auVar74 | auVar8;
        auVar50 = rcpps(_DAT_01f4bd50,auVar68);
        fVar59 = auVar50._0_4_;
        fVar64 = auVar50._4_4_;
        fVar66 = auVar50._8_4_;
        fVar75 = auVar50._12_4_;
        fVar59 = (1.0 - auVar68._0_4_ * fVar59) * fVar59 + fVar59;
        fVar64 = (1.0 - auVar68._4_4_ * fVar64) * fVar64 + fVar64;
        fVar66 = (1.0 - auVar68._8_4_ * fVar66) * fVar66 + fVar66;
        fVar75 = (1.0 - auVar68._12_4_ * fVar75) * fVar75 + fVar75;
        auVar50 = rcpps(auVar50,auVar70);
        fVar76 = auVar50._0_4_;
        fVar77 = auVar50._4_4_;
        fVar78 = auVar50._8_4_;
        fVar79 = auVar50._12_4_;
        fVar76 = (1.0 - auVar70._0_4_ * fVar76) * fVar76 + fVar76;
        fVar77 = (1.0 - auVar70._4_4_ * fVar77) * fVar77 + fVar77;
        fVar78 = (1.0 - auVar70._8_4_ * fVar78) * fVar78 + fVar78;
        fVar79 = (1.0 - auVar70._12_4_ * fVar79) * fVar79 + fVar79;
        auVar50 = rcpps(auVar50,auVar74);
        fVar80 = auVar50._0_4_;
        fVar81 = auVar50._4_4_;
        fVar72 = auVar50._8_4_;
        fVar73 = auVar50._12_4_;
        fVar80 = (1.0 - auVar74._0_4_ * fVar80) * fVar80 + fVar80;
        fVar81 = (1.0 - auVar74._4_4_ * fVar81) * fVar81 + fVar81;
        fVar72 = (1.0 - auVar74._8_4_ * fVar72) * fVar72 + fVar72;
        fVar73 = (1.0 - auVar74._12_4_ * fVar73) * fVar73 + fVar73;
        fVar56 = (*(float *)(uVar18 + 0x20) * fVar32 +
                 *(float *)(uVar18 + 0x50) * fVar33 +
                 *(float *)(uVar18 + 0x80) * fVar34 + *(float *)(uVar18 + 0xb0)) * -fVar59;
        fVar61 = (*(float *)(uVar18 + 0x24) * fVar32 +
                 *(float *)(uVar18 + 0x54) * fVar33 +
                 *(float *)(uVar18 + 0x84) * fVar34 + *(float *)(uVar18 + 0xb4)) * -fVar64;
        auVar38._0_8_ = CONCAT44(fVar61,fVar56);
        auVar38._8_4_ =
             (*(float *)(uVar18 + 0x28) * fVar32 +
             *(float *)(uVar18 + 0x58) * fVar33 +
             *(float *)(uVar18 + 0x88) * fVar34 + *(float *)(uVar18 + 0xb8)) * -fVar66;
        auVar38._12_4_ =
             (*(float *)(uVar18 + 0x2c) * fVar32 +
             *(float *)(uVar18 + 0x5c) * fVar33 +
             *(float *)(uVar18 + 0x8c) * fVar34 + *(float *)(uVar18 + 0xbc)) * -fVar75;
        fVar65 = (*(float *)(uVar18 + 0x30) * fVar32 +
                 *(float *)(uVar18 + 0x60) * fVar33 +
                 *(float *)(uVar18 + 0x90) * fVar34 + *(float *)(uVar18 + 0xc0)) * -fVar76;
        fVar55 = (*(float *)(uVar18 + 0x34) * fVar32 +
                 *(float *)(uVar18 + 100) * fVar33 +
                 *(float *)(uVar18 + 0x94) * fVar34 + *(float *)(uVar18 + 0xc4)) * -fVar77;
        auVar31._0_8_ = CONCAT44(fVar55,fVar65);
        auVar31._8_4_ =
             (*(float *)(uVar18 + 0x38) * fVar32 +
             *(float *)(uVar18 + 0x68) * fVar33 +
             *(float *)(uVar18 + 0x98) * fVar34 + *(float *)(uVar18 + 200)) * -fVar78;
        auVar31._12_4_ =
             (*(float *)(uVar18 + 0x3c) * fVar32 +
             *(float *)(uVar18 + 0x6c) * fVar33 +
             *(float *)(uVar18 + 0x9c) * fVar34 + *(float *)(uVar18 + 0xcc)) * -fVar79;
        fVar62 = (*(float *)(uVar18 + 0x40) * fVar32 +
                 *(float *)(uVar18 + 0x70) * fVar33 +
                 *(float *)(uVar18 + 0xa0) * fVar34 + *(float *)(uVar18 + 0xd0)) * -fVar80;
        fVar58 = (*(float *)(uVar18 + 0x44) * fVar32 +
                 *(float *)(uVar18 + 0x74) * fVar33 +
                 *(float *)(uVar18 + 0xa4) * fVar34 + *(float *)(uVar18 + 0xd4)) * -fVar81;
        auVar43._0_8_ = CONCAT44(fVar58,fVar62);
        auVar43._8_4_ =
             (*(float *)(uVar18 + 0x48) * fVar32 +
             *(float *)(uVar18 + 0x78) * fVar33 +
             *(float *)(uVar18 + 0xa8) * fVar34 + *(float *)(uVar18 + 0xd8)) * -fVar72;
        auVar43._12_4_ =
             (*(float *)(uVar18 + 0x4c) * fVar32 +
             *(float *)(uVar18 + 0x7c) * fVar33 +
             *(float *)(uVar18 + 0xac) * fVar34 + *(float *)(uVar18 + 0xdc)) * -fVar73;
        fVar59 = fVar59 + fVar56;
        fVar64 = fVar64 + fVar61;
        fVar66 = fVar66 + auVar38._8_4_;
        fVar75 = fVar75 + auVar38._12_4_;
        auVar69._0_4_ = fVar76 + fVar65;
        auVar69._4_4_ = fVar77 + fVar55;
        auVar69._8_4_ = fVar78 + auVar31._8_4_;
        auVar69._12_4_ = fVar79 + auVar31._12_4_;
        auVar71._0_4_ = fVar80 + fVar62;
        auVar71._4_4_ = fVar81 + fVar58;
        auVar71._8_4_ = fVar72 + auVar43._8_4_;
        auVar71._12_4_ = fVar73 + auVar43._12_4_;
        auVar47._8_4_ = auVar31._8_4_;
        auVar47._0_8_ = auVar31._0_8_;
        auVar47._12_4_ = auVar31._12_4_;
        auVar50 = minps(auVar47,auVar69);
        auVar51._8_4_ = auVar43._8_4_;
        auVar51._0_8_ = auVar43._0_8_;
        auVar51._12_4_ = auVar43._12_4_;
        auVar37 = minps(auVar51,auVar71);
        auVar48 = maxps(auVar50,auVar37);
        auVar52._8_4_ = auVar38._8_4_;
        auVar52._0_8_ = auVar38._0_8_;
        auVar52._12_4_ = auVar38._12_4_;
        auVar9._4_4_ = fVar64;
        auVar9._0_4_ = fVar59;
        auVar9._8_4_ = fVar66;
        auVar9._12_4_ = fVar75;
        auVar53 = minps(auVar52,auVar9);
        auVar10._4_4_ = fVar64;
        auVar10._0_4_ = fVar59;
        auVar10._8_4_ = fVar66;
        auVar10._12_4_ = fVar75;
        auVar37 = maxps(auVar38,auVar10);
        auVar50 = maxps(auVar31,auVar69);
        auVar41 = maxps(auVar43,auVar71);
        auVar50 = minps(auVar50,auVar41);
        auVar16._4_4_ = fVar60;
        auVar16._0_4_ = fVar60;
        auVar16._8_4_ = fVar60;
        auVar16._12_4_ = fVar60;
        auVar41 = maxps(auVar16,auVar53);
        auVar41 = maxps(auVar41,auVar48);
        auVar37 = minps(auVar67,auVar37);
        auVar50 = minps(auVar37,auVar50);
        bVar3 = auVar41._0_4_ <= auVar50._0_4_;
        bVar4 = auVar41._4_4_ <= auVar50._4_4_;
        bVar5 = auVar41._8_4_ <= auVar50._8_4_;
        bVar6 = auVar41._12_4_ <= auVar50._12_4_;
      }
      auVar42._0_4_ = (uint)bVar3 * -0x80000000;
      auVar42._4_4_ = (uint)bVar4 * -0x80000000;
      auVar42._8_4_ = (uint)bVar5 * -0x80000000;
      auVar42._12_4_ = (uint)bVar6 * -0x80000000;
      uVar25 = movmskps((int)uVar18,auVar42);
      if (uVar25 == 0) goto LAB_00566db0;
      uVar25 = uVar25 & 0xff;
      uVar18 = uVar19 & 0xfffffffffffffff0;
      lVar2 = 0;
      if (uVar25 != 0) {
        for (; (uVar25 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      uVar19 = *(ulong *)(uVar18 + lVar2 * 8);
      uVar25 = uVar25 - 1 & uVar25;
      uVar20 = (ulong)uVar25;
      if (uVar25 != 0) {
        do {
          *puVar22 = uVar19;
          puVar22 = puVar22 + 1;
          lVar2 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          uVar19 = *(ulong *)(uVar18 + lVar2 * 8);
          uVar20 = uVar20 - 1 & uVar20;
        } while (uVar20 != 0);
      }
      goto LAB_00566dc1;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }